

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O2

void audio_callback(void *userdata,Uint8 *stream,int length)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  float *out;
  undefined4 uVar3;
  
  for (uVar2 = 0; (ulong)(long)length >> 2 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = *(ulong *)((long)userdata + 0x4070);
    if (uVar1 < *(ulong *)((long)userdata + 0x4078)) {
      *(ulong *)((long)userdata + 0x4070) = uVar1 + 1;
      uVar3 = *(undefined4 *)((long)userdata + (ulong)((uint)uVar1 & 0xfff) * 4 + 0x70);
      *(undefined4 *)((long)userdata + 0x408c) = uVar3;
    }
    else {
      uVar3 = *(undefined4 *)((long)userdata + 0x408c);
    }
    *(undefined4 *)(stream + uVar2 * 4) = uVar3;
  }
  return;
}

Assistant:

void audio_callback(void* userdata, Uint8* stream, int length) {
    gba_apu_t* apu = (gba_apu_t*)userdata;
    float* out = (float*)stream;
    for (int i = 0; i < length / sizeof(float); i++) {
        if (apu->bigbuffer.read_index < apu->bigbuffer.write_index) {
            apu->apu_last_sample = apu->bigbuffer.buf[(apu->bigbuffer.read_index++) % AUDIO_BIGBUFFER_SIZE];
        }
        *out++ = apu->apu_last_sample;
    }
}